

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall CoinSelection_ConvertToUtxo_Test::TestBody(CoinSelection_ConvertToUtxo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined1 extraout_DL;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  ConfidentialAssetId asset;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *except;
  Utxo utxo;
  void *binary_data;
  Amount amount;
  string output_descriptor;
  Script locking_script;
  uint32_t vout;
  Txid txid;
  BlockHash block_hash;
  uint64_t block_height;
  Utxo *this_01;
  Utxo *lhs;
  Utxo *this_02;
  char *in_stack_fffffffffffff288;
  undefined7 in_stack_fffffffffffff298;
  undefined1 in_stack_fffffffffffff29f;
  uchar *in_stack_fffffffffffff2a0;
  uchar *in_stack_fffffffffffff2a8;
  uint8_t *__arr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff2b0;
  AssertHelper local_a28;
  Message local_a20;
  string local_a18 [40];
  vector local_9f0 [24];
  ByteData local_9d8;
  ConfidentialAssetId local_9c0;
  string local_998 [32];
  AssertionResult local_978;
  AssertHelper local_968;
  Message local_960;
  AssertionResult local_958;
  AssertHelper local_948;
  Message local_940;
  undefined8 local_938;
  AssertionResult local_930;
  AssertHelper local_920;
  Message local_918;
  undefined2 local_90a;
  AssertionResult local_908;
  AssertHelper local_8f8;
  Message local_8f0;
  undefined2 local_8e2;
  AssertionResult local_8e0;
  AssertHelper local_8d0;
  Message local_8c8;
  undefined2 local_8ba;
  AssertionResult local_8b8;
  AssertHelper local_8a8;
  Message local_8a0 [4];
  undefined8 local_880;
  AssertionResult local_878;
  AssertHelper local_868;
  Message local_860;
  AssertionResult local_858;
  AssertHelper local_848;
  Message local_840;
  string local_838 [40];
  vector local_810 [24];
  ByteData256 local_7f8;
  Txid local_7e0;
  string local_7c0 [32];
  AssertionResult local_7a0;
  AssertHelper local_790;
  Message local_788;
  string local_780 [40];
  vector local_758 [24];
  ByteData256 local_740;
  BlockHash local_728;
  string local_708 [32];
  AssertionResult local_6e8;
  AssertHelper local_6d8;
  Message local_6d0;
  AssertionResult local_6c8;
  AssertHelper local_6b8;
  Message local_6b0;
  string local_6a8 [40];
  vector local_680 [24];
  ByteData local_668;
  string local_650 [32];
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  allocator local_609;
  string local_608 [32];
  undefined1 local_5e8 [48];
  Message local_5b8;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  uint8_t local_590 [8];
  AssertionResult local_588;
  AssertHelper local_578;
  Message local_570;
  undefined2 local_562;
  AssertionResult local_560;
  AssertHelper local_550;
  Message local_548;
  undefined2 local_53a;
  AssertionResult local_538;
  AssertHelper local_528;
  Message local_520;
  undefined2 local_512;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8 [4];
  undefined8 local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  AssertionResult local_4b0;
  AssertHelper local_4a0;
  Message local_498;
  string local_490 [40];
  vector local_468 [24];
  ByteData256 local_450;
  Txid local_438;
  string local_418 [32];
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  string local_3d8 [40];
  vector local_3b0 [24];
  ByteData256 local_398;
  BlockHash local_380;
  string local_360 [32];
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  AssertionResult local_320;
  AssertHelper local_310;
  Message local_308;
  string local_300 [40];
  vector local_2d8 [24];
  ByteData local_2c0;
  string local_2a8 [32];
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270 [7];
  Utxo local_238;
  Utxo *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined1 local_140;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  Script local_e8;
  undefined1 local_b0 [8];
  string local_a8 [32];
  Txid local_88;
  allocator local_51;
  string local_50 [32];
  BlockHash local_30;
  ulong local_10;
  
  local_10 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"1234567890123456789012345678901234567890123456789012345678901456",&local_51);
  cfd::core::BlockHash::BlockHash(&local_30,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,"0034567890123456789012345678901234567890123456789012345678901456",
             (allocator *)(local_b0 + 7));
  cfd::core::Txid::Txid(&local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 7));
  local_b0._0_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"0014c59664568fad58004e1fac1b275826d8b525e935",&local_109);
  cfd::core::Script::Script(&local_e8,local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)"
             ,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_158 = cfd::core::Amount::CreateBySatoshiAmount(20000);
  this_01 = (Utxo *)local_b0;
  local_238.fee = 0;
  local_238.long_term_fee = 0;
  local_238.binary_data = (void *)0x0;
  local_238.effective_value = 0;
  local_238.asset[0x17] = '\0';
  local_238.asset[0x18] = '\0';
  local_238.asset[0x19] = '\0';
  local_238.asset[0x1a] = '\0';
  local_238.asset[0x1b] = '\0';
  local_238.asset[0x1c] = '\0';
  local_238.asset[0x1d] = '\0';
  local_238.asset[0x1e] = '\0';
  local_238.asset[0x1f] = '\0';
  local_238.asset[0x20] = '\0';
  local_238._170_6_ = 0;
  local_238.asset[7] = '\0';
  local_238.asset[8] = '\0';
  local_238.asset[9] = '\0';
  local_238.asset[10] = '\0';
  local_238.asset[0xb] = '\0';
  local_238.asset[0xc] = '\0';
  local_238.asset[0xd] = '\0';
  local_238.asset[0xe] = '\0';
  local_238.asset[0xf] = '\0';
  local_238.asset[0x10] = '\0';
  local_238.asset[0x11] = '\0';
  local_238.asset[0x12] = '\0';
  local_238.asset[0x13] = '\0';
  local_238.asset[0x14] = '\0';
  local_238.asset[0x15] = '\0';
  local_238.asset[0x16] = '\0';
  local_238.amount = 0;
  local_238.blinded = false;
  local_238.asset[0] = '\0';
  local_238.asset[1] = '\0';
  local_238.asset[2] = '\0';
  local_238.asset[3] = '\0';
  local_238.asset[4] = '\0';
  local_238.asset[5] = '\0';
  local_238.asset[6] = '\0';
  local_238.locking_script[0x24] = '\0';
  local_238.locking_script[0x25] = '\0';
  local_238.locking_script[0x26] = '\0';
  local_238.locking_script[0x27] = '\0';
  local_238.script_length = 0;
  local_238.address_type = 0;
  local_238.witness_size_max = 0;
  local_238.uscript_size_max = 0;
  local_238._124_4_ = 0;
  local_238.locking_script[0x14] = '\0';
  local_238.locking_script[0x15] = '\0';
  local_238.locking_script[0x16] = '\0';
  local_238.locking_script[0x17] = '\0';
  local_238.locking_script[0x18] = '\0';
  local_238.locking_script[0x19] = '\0';
  local_238.locking_script[0x1a] = '\0';
  local_238.locking_script[0x1b] = '\0';
  local_238.locking_script[0x1c] = '\0';
  local_238.locking_script[0x1d] = '\0';
  local_238.locking_script[0x1e] = '\0';
  local_238.locking_script[0x1f] = '\0';
  local_238.locking_script[0x20] = '\0';
  local_238.locking_script[0x21] = '\0';
  local_238.locking_script[0x22] = '\0';
  local_238.locking_script[0x23] = '\0';
  local_238.locking_script[4] = '\0';
  local_238.locking_script[5] = '\0';
  local_238.locking_script[6] = '\0';
  local_238.locking_script[7] = '\0';
  local_238.locking_script[8] = '\0';
  local_238.locking_script[9] = '\0';
  local_238.locking_script[10] = '\0';
  local_238.locking_script[0xb] = '\0';
  local_238.locking_script[0xc] = '\0';
  local_238.locking_script[0xd] = '\0';
  local_238.locking_script[0xe] = '\0';
  local_238.locking_script[0xf] = '\0';
  local_238.locking_script[0x10] = '\0';
  local_238.locking_script[0x11] = '\0';
  local_238.locking_script[0x12] = '\0';
  local_238.locking_script[0x13] = '\0';
  local_238.txid[0x18] = '\0';
  local_238.txid[0x19] = '\0';
  local_238.txid[0x1a] = '\0';
  local_238.txid[0x1b] = '\0';
  local_238.txid[0x1c] = '\0';
  local_238.txid[0x1d] = '\0';
  local_238.txid[0x1e] = '\0';
  local_238.txid[0x1f] = '\0';
  local_238.vout = 0;
  local_238.locking_script[0] = '\0';
  local_238.locking_script[1] = '\0';
  local_238.locking_script[2] = '\0';
  local_238.locking_script[3] = '\0';
  local_238.txid[8] = '\0';
  local_238.txid[9] = '\0';
  local_238.txid[10] = '\0';
  local_238.txid[0xb] = '\0';
  local_238.txid[0xc] = '\0';
  local_238.txid[0xd] = '\0';
  local_238.txid[0xe] = '\0';
  local_238.txid[0xf] = '\0';
  local_238.txid[0x10] = '\0';
  local_238.txid[0x11] = '\0';
  local_238.txid[0x12] = '\0';
  local_238.txid[0x13] = '\0';
  local_238.txid[0x14] = '\0';
  local_238.txid[0x15] = '\0';
  local_238.txid[0x16] = '\0';
  local_238.txid[0x17] = '\0';
  local_238.block_hash[0x18] = '\0';
  local_238.block_hash[0x19] = '\0';
  local_238.block_hash[0x1a] = '\0';
  local_238.block_hash[0x1b] = '\0';
  local_238.block_hash[0x1c] = '\0';
  local_238.block_hash[0x1d] = '\0';
  local_238.block_hash[0x1e] = '\0';
  local_238.block_hash[0x1f] = '\0';
  local_238.txid[0] = '\0';
  local_238.txid[1] = '\0';
  local_238.txid[2] = '\0';
  local_238.txid[3] = '\0';
  local_238.txid[4] = '\0';
  local_238.txid[5] = '\0';
  local_238.txid[6] = '\0';
  local_238.txid[7] = '\0';
  local_238.block_hash[8] = '\0';
  local_238.block_hash[9] = '\0';
  local_238.block_hash[10] = '\0';
  local_238.block_hash[0xb] = '\0';
  local_238.block_hash[0xc] = '\0';
  local_238.block_hash[0xd] = '\0';
  local_238.block_hash[0xe] = '\0';
  local_238.block_hash[0xf] = '\0';
  local_238.block_hash[0x10] = '\0';
  local_238.block_hash[0x11] = '\0';
  local_238.block_hash[0x12] = '\0';
  local_238.block_hash[0x13] = '\0';
  local_238.block_hash[0x14] = '\0';
  local_238.block_hash[0x15] = '\0';
  local_238.block_hash[0x16] = '\0';
  local_238.block_hash[0x17] = '\0';
  local_238.block_height = 0;
  local_238.block_hash[0] = '\0';
  local_238.block_hash[1] = '\0';
  local_238.block_hash[2] = '\0';
  local_238.block_hash[3] = '\0';
  local_238.block_hash[4] = '\0';
  local_238.block_hash[5] = '\0';
  local_238.block_hash[6] = '\0';
  local_238.block_hash[7] = '\0';
  local_238.effective_k_value = 0;
  lhs = &local_238;
  this_02 = (Utxo *)0x0;
  local_160 = this_01;
  local_150 = extraout_DL;
  local_148 = local_158;
  local_140 = extraout_DL;
  cfd::CoinSelection::ConvertToUtxo
            (local_10,&local_30,&local_88,local_b0._0_4_,&local_e8,local_130,(Amount *)&local_148,
             this_01,lhs,(Script *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      lhs = &local_238;
      this_02 = (Utxo *)0x0;
      this_01 = local_160;
      cfd::CoinSelection::ConvertToUtxo
                (local_10,&local_30,&local_88,local_b0._0_4_,&local_e8,local_130,
                 (Amount *)&local_148,local_160,lhs,(Script *)0x0);
    }
  }
  else {
    testing::Message::Message(local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x295,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x22461a);
  }
  if (local_238.script_length != 0) {
    std::begin<unsigned_char,40ul>(&local_238.locking_script);
    std::begin<unsigned_char,40ul>(&local_238.locking_script);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2246c8);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
               (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
    cfd::core::ByteData::ByteData(&local_2c0,local_2d8);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_288,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2a8);
    cfd::core::ByteData::~ByteData((ByteData *)0x2247a5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2247bf);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2248d4);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x29a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x224937);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x22498c);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->block_height,&this_01->block_height);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x224a2a);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x224a8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x224ae5);
  std::begin<unsigned_char,32ul>(&local_238.block_hash);
  std::end<unsigned_char,32ul>(&local_238.block_hash);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x224b2c);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_398,local_3b0);
  cfd::core::BlockHash::BlockHash(&local_380,&local_398);
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_340,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_360);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x224c20);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x224c2d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x224c47);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x224d94);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x224df7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x224e4f);
  std::begin<unsigned_char,32ul>(&local_238.txid);
  std::end<unsigned_char,32ul>(&local_238.txid);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x224e96);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_450,local_468);
  cfd::core::Txid::Txid(&local_438,&local_450);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3f8,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::string::~string(local_418);
  cfd::core::Txid::~Txid((Txid *)0x224f8a);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x224f97);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x224fb1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2250fe);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message((Message *)0x225161);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2251b6);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff288,(char *)this_02,(uint *)lhs,(uint *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x225252);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x29f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    testing::Message::~Message((Message *)0x2252b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22530d);
  cfd::core::Script::GetData();
  local_4d8 = cfd::core::ByteData::GetDataSize();
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,&this_01->block_height)
  ;
  cfd::core::ByteData::~ByteData((ByteData *)0x225395);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  if (!bVar1) {
    testing::Message::Message(local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x22542a);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_500,local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message((Message *)0x22548d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2254e2);
  local_512 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x225588);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message((Message *)0x2255eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x225640);
  local_53a = 0x6d;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2256e6);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    testing::Message::~Message((Message *)0x225749);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22579e);
  local_562 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x225844);
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    testing::Message::~Message((Message *)0x2258a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2258ff);
  local_590 = (uint8_t  [8])cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<unsigned_long,long>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->block_height,(long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2259d2);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message((Message *)0x225a35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x225a8a);
  testing::internal::EqHelper<false>::Compare<void*,void*>
            (in_stack_fffffffffffff288,(char *)this_02,(void **)lhs,(void **)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x225b26);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_5e8 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2a5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_5e8 + 0x28),&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_5e8 + 0x28));
    testing::Message::~Message((Message *)0x225b89);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x225be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_608,"9934567890123456789012345678901234567890123456789012345678901456",&local_609
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_5e8,local_608);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  local_238.fee = 0;
  local_238.long_term_fee = 0;
  local_238.binary_data = (void *)0x0;
  local_238.effective_value = 0;
  local_238.asset[0x17] = '\0';
  local_238.asset[0x18] = '\0';
  local_238.asset[0x19] = '\0';
  local_238.asset[0x1a] = '\0';
  local_238.asset[0x1b] = '\0';
  local_238.asset[0x1c] = '\0';
  local_238.asset[0x1d] = '\0';
  local_238.asset[0x1e] = '\0';
  local_238.asset[0x1f] = '\0';
  local_238.asset[0x20] = '\0';
  local_238._170_6_ = 0;
  local_238.asset[7] = '\0';
  local_238.asset[8] = '\0';
  local_238.asset[9] = '\0';
  local_238.asset[10] = '\0';
  local_238.asset[0xb] = '\0';
  local_238.asset[0xc] = '\0';
  local_238.asset[0xd] = '\0';
  local_238.asset[0xe] = '\0';
  local_238.asset[0xf] = '\0';
  local_238.asset[0x10] = '\0';
  local_238.asset[0x11] = '\0';
  local_238.asset[0x12] = '\0';
  local_238.asset[0x13] = '\0';
  local_238.asset[0x14] = '\0';
  local_238.asset[0x15] = '\0';
  local_238.asset[0x16] = '\0';
  local_238.amount = 0;
  local_238.blinded = false;
  local_238.asset[0] = '\0';
  local_238.asset[1] = '\0';
  local_238.asset[2] = '\0';
  local_238.asset[3] = '\0';
  local_238.asset[4] = '\0';
  local_238.asset[5] = '\0';
  local_238.asset[6] = '\0';
  local_238.locking_script[0x24] = '\0';
  local_238.locking_script[0x25] = '\0';
  local_238.locking_script[0x26] = '\0';
  local_238.locking_script[0x27] = '\0';
  local_238.script_length = 0;
  local_238.address_type = 0;
  local_238.witness_size_max = 0;
  local_238.uscript_size_max = 0;
  local_238._124_4_ = 0;
  local_238.locking_script[0x14] = '\0';
  local_238.locking_script[0x15] = '\0';
  local_238.locking_script[0x16] = '\0';
  local_238.locking_script[0x17] = '\0';
  local_238.locking_script[0x18] = '\0';
  local_238.locking_script[0x19] = '\0';
  local_238.locking_script[0x1a] = '\0';
  local_238.locking_script[0x1b] = '\0';
  local_238.locking_script[0x1c] = '\0';
  local_238.locking_script[0x1d] = '\0';
  local_238.locking_script[0x1e] = '\0';
  local_238.locking_script[0x1f] = '\0';
  local_238.locking_script[0x20] = '\0';
  local_238.locking_script[0x21] = '\0';
  local_238.locking_script[0x22] = '\0';
  local_238.locking_script[0x23] = '\0';
  local_238.locking_script[4] = '\0';
  local_238.locking_script[5] = '\0';
  local_238.locking_script[6] = '\0';
  local_238.locking_script[7] = '\0';
  local_238.locking_script[8] = '\0';
  local_238.locking_script[9] = '\0';
  local_238.locking_script[10] = '\0';
  local_238.locking_script[0xb] = '\0';
  local_238.locking_script[0xc] = '\0';
  local_238.locking_script[0xd] = '\0';
  local_238.locking_script[0xe] = '\0';
  local_238.locking_script[0xf] = '\0';
  local_238.locking_script[0x10] = '\0';
  local_238.locking_script[0x11] = '\0';
  local_238.locking_script[0x12] = '\0';
  local_238.locking_script[0x13] = '\0';
  local_238.txid[0x18] = '\0';
  local_238.txid[0x19] = '\0';
  local_238.txid[0x1a] = '\0';
  local_238.txid[0x1b] = '\0';
  local_238.txid[0x1c] = '\0';
  local_238.txid[0x1d] = '\0';
  local_238.txid[0x1e] = '\0';
  local_238.txid[0x1f] = '\0';
  local_238.vout = 0;
  local_238.locking_script[0] = '\0';
  local_238.locking_script[1] = '\0';
  local_238.locking_script[2] = '\0';
  local_238.locking_script[3] = '\0';
  local_238.txid[8] = '\0';
  local_238.txid[9] = '\0';
  local_238.txid[10] = '\0';
  local_238.txid[0xb] = '\0';
  local_238.txid[0xc] = '\0';
  local_238.txid[0xd] = '\0';
  local_238.txid[0xe] = '\0';
  local_238.txid[0xf] = '\0';
  local_238.txid[0x10] = '\0';
  local_238.txid[0x11] = '\0';
  local_238.txid[0x12] = '\0';
  local_238.txid[0x13] = '\0';
  local_238.txid[0x14] = '\0';
  local_238.txid[0x15] = '\0';
  local_238.txid[0x16] = '\0';
  local_238.txid[0x17] = '\0';
  local_238.block_hash[0x18] = '\0';
  local_238.block_hash[0x19] = '\0';
  local_238.block_hash[0x1a] = '\0';
  local_238.block_hash[0x1b] = '\0';
  local_238.block_hash[0x1c] = '\0';
  local_238.block_hash[0x1d] = '\0';
  local_238.block_hash[0x1e] = '\0';
  local_238.block_hash[0x1f] = '\0';
  local_238.txid[0] = '\0';
  local_238.txid[1] = '\0';
  local_238.txid[2] = '\0';
  local_238.txid[3] = '\0';
  local_238.txid[4] = '\0';
  local_238.txid[5] = '\0';
  local_238.txid[6] = '\0';
  local_238.txid[7] = '\0';
  local_238.block_hash[8] = '\0';
  local_238.block_hash[9] = '\0';
  local_238.block_hash[10] = '\0';
  local_238.block_hash[0xb] = '\0';
  local_238.block_hash[0xc] = '\0';
  local_238.block_hash[0xd] = '\0';
  local_238.block_hash[0xe] = '\0';
  local_238.block_hash[0xf] = '\0';
  local_238.block_hash[0x10] = '\0';
  local_238.block_hash[0x11] = '\0';
  local_238.block_hash[0x12] = '\0';
  local_238.block_hash[0x13] = '\0';
  local_238.block_hash[0x14] = '\0';
  local_238.block_hash[0x15] = '\0';
  local_238.block_hash[0x16] = '\0';
  local_238.block_hash[0x17] = '\0';
  local_238.block_height = 0;
  local_238.block_hash[0] = '\0';
  local_238.block_hash[1] = '\0';
  local_238.block_hash[2] = '\0';
  local_238.block_hash[3] = '\0';
  local_238.block_hash[4] = '\0';
  local_238.block_hash[5] = '\0';
  local_238.block_hash[6] = '\0';
  local_238.block_hash[7] = '\0';
  local_238.effective_k_value = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      this_02 = &local_238;
      this_01 = (Utxo *)local_5e8;
      in_stack_fffffffffffff288 = (char *)0x0;
      lhs = local_160;
      cfd::CoinSelection::ConvertToUtxo
                (local_10,&local_30,&local_88,local_b0._0_4_,&local_e8,local_130,
                 (Amount *)&local_148,(ConfidentialAssetId *)this_01,local_160,this_02,(Script *)0x0
                );
    }
  }
  else {
    testing::Message::Message(&local_618);
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ac,
               "Expected: (CoinSelection::ConvertToUtxo( block_height, block_hash, txid, vout, locking_script, output_descriptor, amount, asset, binary_data, &utxo)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::Message::~Message((Message *)0x225e8e);
  }
  if (local_238.script_length != 0) {
    std::begin<unsigned_char,40ul>(&local_238.locking_script);
    std::begin<unsigned_char,40ul>(&local_238.locking_script);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x225f3c);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
               (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
    cfd::core::ByteData::ByteData(&local_668,local_680);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_630,
               "ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str()"
               ,"locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string(local_6a8);
    std::__cxx11::string::~string(local_650);
    cfd::core::ByteData::~ByteData((ByteData *)0x226019);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x226033);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_630);
    if (!bVar1) {
      testing::Message::Message(&local_6b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226148);
      testing::internal::AssertHelper::AssertHelper
                (&local_6b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x2b1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
      testing::internal::AssertHelper::~AssertHelper(&local_6b8);
      testing::Message::~Message((Message *)0x2261ab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x226200);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->block_height,&this_01->block_height);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x22629e);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    testing::Message::~Message((Message *)0x226301);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226359);
  std::begin<unsigned_char,32ul>(&local_238.block_hash);
  std::end<unsigned_char,32ul>(&local_238.block_hash);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2263a0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_740,local_758);
  cfd::core::BlockHash::BlockHash(&local_728,&local_740);
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::BlockHash::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_6e8,
             "BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str()"
             ,"block_hash.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_780);
  std::__cxx11::string::~string(local_708);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x226494);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x2264a1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2264bb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226608);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message((Message *)0x22666b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2266c3);
  std::begin<unsigned_char,32ul>(&local_238.txid);
  std::end<unsigned_char,32ul>(&local_238.txid);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x22670a);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData256::ByteData256(&local_7f8,local_810);
  cfd::core::Txid::Txid(&local_7e0,&local_7f8);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7a0,
             "Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str()"
             ,"txid.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_7c0);
  cfd::core::Txid::~Txid((Txid *)0x2267fe);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x22680b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x226825);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226972);
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    testing::Message::~Message((Message *)0x2269d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226a2a);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff288,(char *)this_02,(uint *)lhs,(uint *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226ac6);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    testing::Message::~Message((Message *)0x226b29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226b81);
  cfd::core::Script::GetData();
  local_880 = cfd::core::ByteData::GetDataSize();
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_long>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,&this_01->block_height)
  ;
  cfd::core::ByteData::~ByteData((ByteData *)0x226c09);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_878);
  if (!bVar1) {
    testing::Message::Message(local_8a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226c9e);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8a8,local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    testing::Message::~Message((Message *)0x226d01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226d56);
  local_8ba = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226dfc);
    testing::internal::AssertHelper::AssertHelper
              (&local_8d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d0);
    testing::Message::~Message((Message *)0x226e5f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226eb4);
  local_8e2 = 0x6d;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x226f5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    testing::Message::~Message((Message *)0x226fbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x227012);
  local_90a = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
            (in_stack_fffffffffffff288,(char *)this_02,(unsigned_short *)lhs,
             (unsigned_short *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_908);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2270b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::Message::~Message((Message *)0x22711b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x227173);
  local_938 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<unsigned_long,long>
            (in_stack_fffffffffffff288,(char *)this_02,&lhs->block_height,(long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_930);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x227240);
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,699,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    testing::Message::~Message((Message *)0x22729d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2272f2);
  testing::internal::EqHelper<false>::Compare<void*,void*>
            (in_stack_fffffffffffff288,(char *)this_02,(void **)lhs,(void **)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_958);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x227388);
    testing::internal::AssertHelper::AssertHelper
              (&local_968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,700,pcVar2);
    testing::internal::AssertHelper::operator=(&local_968,&local_960);
    testing::internal::AssertHelper::~AssertHelper(&local_968);
    testing::Message::~Message((Message *)0x2273e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22743d);
  __arr = local_238.asset;
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            std::begin<unsigned_char,33ul>(&__arr);
  std::end<unsigned_char,33ul>((uchar (*) [33])__arr);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x227475);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (this_00,__arr,in_stack_fffffffffffff2a0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
  cfd::core::ByteData::ByteData(&local_9d8,local_9f0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_9c0,&local_9d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_978,
             "ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str()"
             ,"asset.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_998);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x22755a);
  cfd::core::ByteData::~ByteData((ByteData *)0x227567);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x227581);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_978);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2276c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x2bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a28,&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_a28);
    testing::Message::~Message((Message *)0x227725);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22777a);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x227787);
  std::__cxx11::string::~string(local_130);
  cfd::core::Script::~Script((Script *)this_01);
  cfd::core::Txid::~Txid((Txid *)0x2277ae);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x2277bb);
  return;
}

Assistant:

TEST(CoinSelection, ConvertToUtxo)
{
  uint64_t block_height = 1;
  BlockHash block_hash("1234567890123456789012345678901234567890123456789012345678901456");
  Txid txid("0034567890123456789012345678901234567890123456789012345678901456");
  uint32_t vout = 2;
  Script locking_script("0014c59664568fad58004e1fac1b275826d8b525e935");
  std::string output_descriptor("wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1)");
  Amount amount = Amount::CreateBySatoshiAmount(20000);
  void* binary_data = &vout;
  Utxo utxo = {};
  // std::vector<uint8_t> script_bytes;

  try {
    CoinSelection::ConvertToUtxo(
      block_height, block_hash, txid, vout, locking_script,
      output_descriptor, amount, binary_data, &utxo);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);

#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset("9934567890123456789012345678901234567890123456789012345678901456");
  memset(&utxo, 0, sizeof(utxo));
  EXPECT_NO_THROW((CoinSelection::ConvertToUtxo(
    block_height, block_hash, txid, vout, locking_script,
    output_descriptor, amount, asset, binary_data, &utxo)));

  if (utxo.script_length != 0) {
    // script_bytes.resize(utxo.script_length);
    // memcpy(script_bytes.data(), utxo.locking_script, utxo.script_length);
    EXPECT_STREQ(ByteData(std::vector<uint8_t>(std::begin(utxo.locking_script), std::begin(utxo.locking_script) + utxo.script_length)).GetHex().c_str(), locking_script.GetHex().c_str());
  }
  EXPECT_EQ(utxo.block_height, block_height);
  EXPECT_STREQ(BlockHash(ByteData256(std::vector<uint8_t>(std::begin(utxo.block_hash), std::end(utxo.block_hash)))).GetHex().c_str(), block_hash.GetHex().c_str());
  EXPECT_STREQ(Txid(ByteData256(std::vector<uint8_t>(std::begin(utxo.txid), std::end(utxo.txid)))).GetHex().c_str(), txid.GetHex().c_str());
  EXPECT_EQ(utxo.vout, vout);
  EXPECT_EQ(utxo.script_length, locking_script.GetData().GetDataSize());
  EXPECT_EQ(utxo.address_type, static_cast<uint16_t>(AddressType::kP2wpkhAddress));
  EXPECT_EQ(utxo.witness_size_max, static_cast<uint16_t>(109));
  EXPECT_EQ(utxo.uscript_size_max, static_cast<uint16_t>(0));
  EXPECT_EQ(utxo.amount, amount.GetSatoshiValue());
  EXPECT_EQ(utxo.binary_data, binary_data);
  EXPECT_STREQ(ConfidentialAssetId(ByteData(std::vector<uint8_t>(std::begin(utxo.asset), std::end(utxo.asset)))).GetHex().c_str(), asset.GetHex().c_str());
#endif                // CFD_DISABLE_ELEMENTS
}